

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_cab.c
# Opt level: O2

ssize_t cab_strnlen(uchar *p,size_t maxlen)

{
  ulong uVar1;
  ulong uVar2;
  
  for (uVar2 = 0; (uVar1 = 0xffffffffffffffff, uVar2 <= maxlen && (uVar1 = uVar2, p[uVar2] != '\0'))
      ; uVar2 = uVar2 + 1) {
  }
  return uVar1;
}

Assistant:

static ssize_t
cab_strnlen(const unsigned char *p, size_t maxlen)
{
	size_t i;

	for (i = 0; i <= maxlen; i++) {
		if (p[i] == 0)
			break;
	}
	if (i > maxlen)
		return (-1);/* invalid */
	return ((ssize_t)i);
}